

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleHashedEntry<Js::NumberTrio,_Js::NumberTrio> * __thiscall
Memory::
AllocateArray<Memory::NoCheckHeapAllocator,JsUtil::SimpleHashedEntry<Js::NumberTrio,Js::NumberTrio>,false>
          (Memory *this,NoCheckHeapAllocator *allocator,
          offset_in_NoCheckHeapAllocator_to_subr AllocFunc,size_t count)

{
  ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio> *pIVar1;
  SimpleHashedEntry<Js::NumberTrio,_Js::NumberTrio> *pSVar2;
  long lVar3;
  SimpleHashedEntry<Js::NumberTrio,_Js::NumberTrio> *pSVar4;
  long *plVar5;
  
  lVar3 = -(count >> 0x3c);
  plVar5 = (long *)((long)&(this->name)._M_dataplus._M_p + AllocFunc);
  if (((ulong)allocator & 1) != 0) {
    lVar3 = *plVar5;
    allocator = *(NoCheckHeapAllocator **)(allocator + lVar3 + -1);
  }
  pSVar2 = (SimpleHashedEntry<Js::NumberTrio,_Js::NumberTrio> *)
           (*(code *)allocator)(plVar5,-(ulong)(count >> 0x3c != 0) | count * 0x10,AllocFunc,lVar3);
  if (count != 0) {
    pSVar4 = pSVar2;
    do {
      pIVar1 = &(pSVar4->
                super_DefaultHashedEntry<Js::NumberTrio,_Js::NumberTrio,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                ).super_ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio>;
      (pIVar1->
      super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
      ).super_ValueEntryData<Js::NumberTrio>.value.x = 0xffffffff;
      (pIVar1->
      super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
      ).super_ValueEntryData<Js::NumberTrio>.value.y = 0xffffffff;
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar2 + count);
  }
  return pSVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}